

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall
SimpleString::subStringFromTill(SimpleString *this,char startChar,char lastExcludedChar)

{
  size_t sVar1;
  size_t amount;
  undefined1 in_CL;
  undefined1 in_DL;
  size_t extraout_RDX;
  size_t in_RSI;
  SimpleString *in_RDI;
  SimpleString SVar2;
  size_t endPos;
  size_t beginPos;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  SimpleString *this_00;
  SimpleString *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  sVar1 = find(in_RDI,in_stack_ffffffffffffffbf);
  if (sVar1 == 0xffffffffffffffff) {
    SimpleString(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    sVar1 = extraout_RDX;
  }
  else {
    amount = findFrom(in_stack_ffffffffffffffd8,in_RSI,(char)((ulong)this_00 >> 0x38));
    if (amount == 0xffffffffffffffff) {
      SVar2 = subString(this_00,(size_t)in_RDI);
      sVar1 = SVar2.bufferSize_;
    }
    else {
      SVar2 = subString((SimpleString *)CONCAT17(in_DL,CONCAT16(in_CL,in_stack_ffffffffffffffe8)),
                        sVar1,amount);
      sVar1 = SVar2.bufferSize_;
    }
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)this_00;
  return SVar2;
}

Assistant:

SimpleString SimpleString::subStringFromTill(char startChar, char lastExcludedChar) const
{
    size_t beginPos = find(startChar);
    if (beginPos == npos) return "";

    size_t endPos = findFrom(beginPos, lastExcludedChar);
    if (endPos == npos) return subString(beginPos);

    return subString(beginPos, endPos - beginPos);
}